

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O0

double __thiscall tri_cc_geom_t::compute_average_length(tri_cc_geom_t *this)

{
  uint uVar1;
  RealScalar RVar2;
  vertex_t local_c0;
  vertex_t local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_90;
  cellid_t local_78;
  cellid_t local_74;
  cellid_t pts [20];
  uint local_1c;
  cellid_t c_end;
  cellid_t c;
  double avg_el;
  tri_cc_geom_t *this_local;
  
  _c_end = 0.0;
  local_1c = get_num_cells_max_dim(this,0);
  uVar1 = get_num_cells_max_dim(this,1);
  for (; local_1c != uVar1; local_1c = local_1c + 1) {
    get_cell_points(this,local_1c,&local_78);
    get_cell_position(&local_a8,this,local_78);
    get_cell_position(&local_c0,this,local_74);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              (&local_90,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&local_a8,
               (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&local_c0);
    RVar2 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    *)&local_90);
    _c_end = RVar2 + _c_end;
  }
  uVar1 = get_num_cells_dim(this,1);
  return _c_end / (double)uVar1;
}

Assistant:

double tri_cc_geom_t::compute_average_length()
{
  double avg_el = 0;

  for(cellid_t c = get_num_cells_max_dim(0),c_end = get_num_cells_max_dim(1);c != c_end; ++c)
  {
    cellid_t pts[20];

    get_cell_points(c,pts);

    avg_el += (get_cell_position(pts[0])-get_cell_position(pts[1])).norm();
  }

  return avg_el/get_num_cells_dim(1);
}